

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  char *__s;
  size_t sVar5;
  ostream *poVar6;
  Indent IVar7;
  string local_78;
  string *local_58;
  string local_50;
  
  this_00 = this->Target->Target->Makefile;
  local_58 = toDestDirPath;
  bVar3 = cmMakefile::PlatformIsAppleIos(this_00);
  if (bVar3) {
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"XCODE","");
    bVar3 = cmMakefile::IsOn(this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"XCODE_VERSION","");
      __s = cmMakefile::GetDefinition(this_00,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (__s != (char *)0x0) {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"6","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
        bVar3 = cmSystemTools::VersionCompareGreater(&local_78,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar3) && (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 < OBJECT_LIBRARY))
        {
          pcVar2 = this->Target->Target;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"IOS_INSTALL_COMBINED","");
          bVar3 = cmTarget::GetPropertyAsBool(pcVar2,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) {
            IVar7.Level = indent.Level;
            if (indent.Level < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"include(CMakeIOSInstallCombined)\n",0x21);
            }
            else {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar7.Level = IVar7.Level + -1;
              } while (IVar7.Level != 0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"include(CMakeIOSInstallCombined)\n",0x21);
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                indent.Level = indent.Level + -1;
              } while (indent.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"ios_install_combined(",0x15);
            std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
            pcVar2 = this->Target->Target;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,(pcVar2->Name)._M_dataplus._M_p,(pcVar2->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(local_58->_M_dataplus)._M_p,local_58->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleIos() || !mf->IsOn("XCODE")) {
    return;
  }

  const char* xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}